

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

int argon2_verify_ctx(argon2_context *context,char *hash,argon2_type type)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  
  iVar1 = argon2_ctx(context,type);
  if (iVar1 == 0) {
    bVar3 = 0;
    for (uVar2 = 0; context->outlen != uVar2; uVar2 = uVar2 + 1) {
      bVar3 = bVar3 | context->out[uVar2] ^ hash[uVar2];
    }
    iVar1 = -0x23;
    if ((bVar3 - 1 >> 8 & 1) != 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int argon2_verify_ctx(argon2_context *context, const char *hash,
                      argon2_type type) {
    int ret = argon2_ctx(context, type);
    if (ret != ARGON2_OK) {
        return ret;
    }

    if (argon2_compare((uint8_t *)hash, context->out, context->outlen)) {
        return ARGON2_VERIFY_MISMATCH;
    }

    return ARGON2_OK;
}